

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O3

int init_reg_rules_alloc(Dwarf_Debug dbg,Dwarf_Frame_s *f,Dwarf_Unsigned count,Dwarf_Error *error)

{
  Dwarf_Unsigned DVar1;
  Dwarf_Reg_Rule_s *r;
  Dwarf_Reg_Rule_s *pDVar2;
  int iVar3;
  
  f->fr_reg_count = count;
  pDVar2 = (Dwarf_Reg_Rule_s *)calloc(count,0x40);
  f->fr_reg = pDVar2;
  if (pDVar2 == (Dwarf_Reg_Rule_s *)0x0) {
    iVar3 = 1;
    if (error != (Dwarf_Error *)0x0) {
      _dwarf_error(dbg,error,0xc0);
    }
  }
  else {
    iVar3 = 0;
    if (count != 0) {
      DVar1 = dbg->de_frame_rule_initial_value;
      do {
        pDVar2->ru_is_offset = '\0';
        pDVar2->ru_value_type = '\0';
        pDVar2->ru_register = DVar1;
        pDVar2->ru_offset = 0;
        pDVar2->ru_args_size = 0;
        (pDVar2->ru_block).bl_len = 0;
        (pDVar2->ru_block).bl_data = (Dwarf_Ptr)0x0;
        pDVar2 = pDVar2 + 1;
        count = count - 1;
        iVar3 = 0;
      } while (count != 0);
    }
  }
  return iVar3;
}

Assistant:

static int
init_reg_rules_alloc(Dwarf_Debug dbg,struct Dwarf_Frame_s *f,
    Dwarf_Unsigned count, Dwarf_Error * error)
{
    f->fr_reg_count = count;
    f->fr_reg = (struct Dwarf_Reg_Rule_s *)
        calloc((size_t)count, sizeof(struct Dwarf_Reg_Rule_s));
    if (f->fr_reg == 0) {
        if (error) {
            _dwarf_error(dbg, error, DW_DLE_DF_ALLOC_FAIL);
        }
        return DW_DLV_ERROR;
    }
    _dwarf_init_reg_rules_ru(f->fr_reg,0, count,
        dbg->de_frame_rule_initial_value);
    return DW_DLV_OK;
}